

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.h
# Opt level: O3

void __thiscall
mp::SOLReader2<ExampleSOLHandler>::SOLReader2
          (SOLReader2<ExampleSOLHandler> *this,ExampleSOLHandler *sh,NLUtils *utl)

{
  this->solh_ = sh;
  this->utils_ = utl;
  ExampleModel::Header(&this->hdr_,sh->mdl_);
  (this->solve_msg_)._M_dataplus._M_p = (pointer)&(this->solve_msg_).field_2;
  (this->solve_msg_)._M_string_length = 0;
  (this->solve_msg_).field_2._M_local_buf[0] = '\0';
  (this->err_msg_)._M_dataplus._M_p = (pointer)&(this->err_msg_).field_2;
  (this->err_msg_)._M_string_length = 0;
  (this->err_msg_).field_2._M_local_buf[0] = '\0';
  this->internal_rv_ = 0;
  this->readresult_ = NLW2_SOLRead_Result_Not_Set;
  this->stub_ = (char *)0x0;
  this->bkind[0] = "ASCII";
  this->bkind[1] = "binary";
  this->Objno[0] = -2;
  this->Objno[1] = -2;
  this->objno = -2;
  return;
}

Assistant:

SOLReader2(SOLHandler& sh, NLUtils& utl) :
			solh_(sh), utils_(utl), hdr_(sh.Header()) { }